

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O0

void __thiscall
groundupdbext::FileKeyValueStore::setKeyValue(FileKeyValueStore *this,HashedValue *key,Set *value)

{
  bool bVar1;
  Type t;
  size_t sVar2;
  pointer pIVar3;
  pointer puVar4;
  size_type sVar5;
  void *pvVar6;
  pointer pEVar7;
  ostream *poVar8;
  reference pbVar9;
  byte *b_1;
  const_iterator __end1;
  const_iterator __begin1;
  Bytes *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  _Node_iterator_base<groundupdb::EncodedValue,_true> local_300;
  reference local_2f8;
  byte *b;
  const_iterator __end2;
  const_iterator __begin2;
  Bytes *__range2;
  _Node_iterator_base<groundupdb::EncodedValue,_true> local_2b8;
  iterator val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  string fp;
  undefined1 local_240 [8];
  string keyHash;
  ofstream os;
  Set *value_local;
  HashedValue *key_local;
  FileKeyValueStore *this_local;
  
  std::ofstream::ofstream((void *)((long)&keyHash.field_2 + 8));
  sVar2 = groundupdb::HashedValue::hash(key);
  std::__cxx11::to_string((string *)local_240,sVar2);
  pIVar3 = std::
           unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                 &pIVar3->m_fullpath,"/");
  std::operator+(&local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                 &local_290,".kv");
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&val);
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((string *)(keyHash.field_2._M_local_buf + 8),(_Ios_Openmode)local_270);
  puVar4 = std::
           unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
           ::operator->(value);
  sVar5 = std::
          unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
          ::size(puVar4);
  pvVar6 = (void *)std::ostream::operator<<((void *)((long)&keyHash.field_2 + 8),sVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  puVar4 = std::
           unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
           ::operator->(value);
  local_2b8._M_cur =
       (__node_type *)
       std::
       unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
       ::begin(puVar4);
  while( true ) {
    puVar4 = std::
             unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
             ::operator->(value);
    __range2 = (Bytes *)std::
                        unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
                        ::end(puVar4);
    bVar1 = std::__detail::operator!=
                      (&local_2b8,(_Node_iterator_base<groundupdb::EncodedValue,_true> *)&__range2);
    if (!bVar1) break;
    pEVar7 = std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator->
                       ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_2b8);
    bVar1 = groundupdb::EncodedValue::hasValue(pEVar7);
    pvVar6 = (void *)std::ostream::operator<<((void *)((long)&keyHash.field_2 + 8),bVar1);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pEVar7 = std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator->
                       ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_2b8);
    t = groundupdb::EncodedValue::type(pEVar7);
    poVar8 = groundupdb::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),t);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    pEVar7 = std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator->
                       ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_2b8);
    sVar2 = groundupdb::EncodedValue::length(pEVar7);
    pvVar6 = (void *)std::ostream::operator<<((void *)((long)&keyHash.field_2 + 8),sVar2);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    pEVar7 = std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator->
                       ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_2b8);
    groundupdb::EncodedValue::data((Bytes *)&__begin2,pEVar7);
    __end2 = std::vector<std::byte,_std::allocator<std::byte>_>::begin
                       ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin2);
    b = (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end
                          ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                  *)&b);
      if (!bVar1) break;
      local_2f8 = __gnu_cxx::
                  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                  ::operator*(&__end2);
      std::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),*local_2f8);
      __gnu_cxx::
      __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
      operator++(&__end2);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin2);
    std::ostream::operator<<
              ((void *)((long)&keyHash.field_2 + 8),std::endl<char,std::char_traits<char>>);
    pEVar7 = std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator->
                       ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_2b8);
    sVar2 = groundupdb::EncodedValue::hash(pEVar7);
    pvVar6 = (void *)std::ostream::operator<<((void *)((long)&keyHash.field_2 + 8),sVar2);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    local_300._M_cur =
         (__node_type *)
         std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator++
                   ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_2b8,0);
  }
  std::ofstream::close();
  pIVar3 = std::
           unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 &pIVar3->m_fullpath,"/");
  std::operator+(&local_340,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  std::operator+(&local_320,&local_340,".key");
  std::operator|(_S_out,_S_trunc);
  std::ofstream::open((string *)(keyHash.field_2._M_local_buf + 8),(_Ios_Openmode)&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&__range1);
  poVar8 = std::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),"set");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  groundupdb::HashedValue::data((Bytes *)&__begin1,key);
  __end1 = std::vector<std::byte,_std::allocator<std::byte>_>::begin
                     ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin1);
  b_1 = (byte *)std::vector<std::byte,_std::allocator<std::byte>_>::end
                          ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                *)&b_1);
    if (!bVar1) break;
    pbVar9 = __gnu_cxx::
             __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
             ::operator*(&__end1);
    std::operator<<((ostream *)(keyHash.field_2._M_local_buf + 8),*pbVar9);
    __gnu_cxx::
    __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
    operator++(&__end1);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin1);
  std::ostream::operator<<
            ((void *)((long)&keyHash.field_2 + 8),std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::~string((string *)local_240);
  std::ofstream::~ofstream((void *)((long)&keyHash.field_2 + 8));
  return;
}

Assistant:

void
FileKeyValueStore::setKeyValue(const HashedValue& key,const Set& value) {
  // store in _string_set.kl file elements_num<length,value...>...
  std::ofstream os;
  std::string keyHash(std::to_string(key.hash()));
  std::string fp(mImpl->m_fullpath + "/" + keyHash + ".kv");
  os.open(fp,
          std::ios::out | std::ios::trunc);
  os << value->size() << std::endl;
  for (auto val = value->begin();val != value->end(); val++) {
    //std::cout << "  Writing set value with length: " << val->length() << ", hash: " << val->hash() << std::endl;
    os << val->hasValue() << std::endl;
    os << val->type() << std::endl;
    os << val->length() << std::endl;
    for (auto& b : val->data()) {
      os << (const char)b;
    }
    os << std::endl;
    os << val->hash() << std::endl;
  }
  os.close();
  // TODO allow multiple keys for this hash (read, modify, write)
  os.open(mImpl->m_fullpath + "/" + keyHash + ".key",
          std::ios::out | std::ios::trunc);
  os << "set" << std::endl;
  for (auto& b : key.data()) {
    os << (const char)b;
  }
  os << std::endl;
  os.close();
}